

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

bool __thiscall TcpServerImpl::Start(TcpServerImpl *this,char *szIpAddr,uint16_t sPort)

{
  iterator __position;
  int iVar1;
  int *piVar2;
  int *piVar3;
  undefined6 in_register_00000012;
  bool bVar4;
  addrinfo *paVar5;
  uint __len;
  uint32_t on;
  addrinfo *lstAddr;
  string __str;
  thread local_98;
  addrinfo *local_90;
  code *local_88;
  undefined8 local_80;
  long local_78 [2];
  addrinfo local_68;
  TcpServerImpl *local_38;
  
  local_90 = (addrinfo *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  __len = 1;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 1;
  local_68.ai_family = 0;
  if ((9 < sPort) && (__len = 2, 99 < sPort)) {
    __len = 3;
    if (999 < sPort) {
      __len = 5 - (sPort < 10000);
    }
  }
  local_88 = (code *)local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_88,__len,(uint)CONCAT62(in_register_00000012,sPort));
  iVar1 = getaddrinfo(szIpAddr,(char *)local_88,&local_68,&local_90);
  if (local_88 != (code *)local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (iVar1 == 0) {
    if (local_90 != (addrinfo *)0x0) {
      paVar5 = local_90;
      do {
        iVar1 = socket(paVar5->ai_family,paVar5->ai_socktype,paVar5->ai_protocol);
        local_88 = (code *)CONCAT44(local_88._4_4_,iVar1);
        if (iVar1 == -1) {
LAB_0011ad1d:
          piVar2 = (int *)__cxa_allocate_exception(4);
          piVar3 = __errno_location();
          *piVar2 = *piVar3;
          __cxa_throw(piVar2,&int::typeinfo,0);
        }
        __position._M_current =
             (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->m_vSock,__position,(int *)&local_88);
        }
        else {
          *__position._M_current = iVar1;
          (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(this,&local_88);
        if (paVar5->ai_family == 10) {
          local_98._M_id._M_thread._0_4_ = 1;
          iVar1 = setsockopt((int)local_88,0x29,0x1a,&local_98,4);
          if (iVar1 == -1) {
            piVar2 = (int *)__cxa_allocate_exception(4);
            piVar3 = __errno_location();
            *piVar2 = *piVar3;
            __cxa_throw(piVar2,&int::typeinfo,0);
          }
        }
        iVar1 = bind((int)local_88,paVar5->ai_addr,paVar5->ai_addrlen);
        if (iVar1 < 0) goto LAB_0011ad1d;
        paVar5 = paVar5->ai_next;
      } while (paVar5 != (addrinfo *)0x0);
    }
    piVar3 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar2 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar2 != piVar3; piVar2 = piVar2 + 1) {
      iVar1 = listen(*piVar2,0x1000);
      if (iVar1 < 0) {
        piVar2 = (int *)__cxa_allocate_exception(4);
        piVar3 = __errno_location();
        *piVar2 = *piVar3;
        __cxa_throw(piVar2,&int::typeinfo,0);
      }
    }
    (this->super_BaseSocketImpl).m_bStop = false;
    local_88 = SelectThread;
    local_80 = 0;
    local_38 = this;
    std::thread::thread<void(TcpServerImpl::*)(),TcpServerImpl*,void>
              (&local_98,(offset_in_TcpServerImpl_to_subr *)&local_88,&local_38);
    if ((this->super_BaseSocketImpl).m_thListen._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->super_BaseSocketImpl).m_thListen._M_id._M_thread =
         CONCAT44(local_98._M_id._M_thread._4_4_,(undefined4)local_98._M_id._M_thread);
    bVar4 = true;
    freeaddrinfo(local_90);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool TcpServerImpl::Start(const char* const szIpAddr, const uint16_t sPort)
{
    struct addrinfo *lstAddr{}, hint{};
    hint.ai_family = AF_UNSPEC;
    hint.ai_socktype = SOCK_STREAM;
    hint.ai_flags = AI_PASSIVE;

    if (::getaddrinfo(szIpAddr, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        for (auto curAddr = lstAddr; curAddr != nullptr; curAddr = curAddr->ai_next)
        {
            const SOCKET fd = ::socket(curAddr->ai_family, curAddr->ai_socktype, curAddr->ai_protocol);
            if (fd == INVALID_SOCKET)
                throw WSAGetLastError();

            m_vSock.push_back(fd);

            SetSocketOption(fd);

            if (curAddr->ai_family == AF_INET6)
            {
                constexpr uint32_t on = 1;
                if (::setsockopt(fd, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                    throw WSAGetLastError();
            }

            if (::bind(fd, curAddr->ai_addr, static_cast<int>(curAddr->ai_addrlen)) < 0)
                throw WSAGetLastError();    // https://docs.microsoft.com/de-de/troubleshoot/windows-server/backup-and-storage/error-10013-wsaeacces-is-returned
        }                                   // netsh int ipv4 show excludedportrange protocol = tcp

        for (auto fSock : m_vSock)
        {
            if (::listen(fSock, SOMAXCONN) < 0)
                throw WSAGetLastError();
        }

        m_bStop = false;
        m_thListen = thread(&TcpServerImpl::SelectThread, this);
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;
        Delete();
        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}